

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::fetchSampleValue
          (ImageSampleInstanceImages *this,int samplePosNdx)

{
  VkImageViewType VVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  uint in_EDX;
  VkImageViewType *pVVar5;
  deUint32 level_1;
  VkImageViewType VVar6;
  deUint32 level_3;
  undefined4 in_register_00000034;
  VkImageViewType *pVVar7;
  VkImageViewType *pVVar8;
  deUint32 level;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar10;
  Vec4 samplePos;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levelStorage;
  ConstPixelBufferAccess wholeLevel;
  WrapMode local_68;
  ConstPixelBufferAccess local_58;
  undefined8 uVar9;
  
  pVVar7 = (VkImageViewType *)CONCAT44(in_register_00000034,samplePosNdx);
  pVVar8 = pVVar7 + 6;
  if (pVVar7[0x4a] != VK_IMAGE_VIEW_TYPE_1D) {
    pVVar5 = pVVar7 + 0x14;
    if (pVVar7[0x4b] == VK_IMAGE_VIEW_TYPE_1D) {
      pVVar5 = pVVar8;
    }
    if ((in_EDX & 1) != 0) {
      pVVar8 = pVVar5;
    }
  }
  VVar10 = getSamplePos((ImageSampleInstanceImages *)&samplePos,*pVVar7,pVVar7[1],pVVar7[2],in_EDX);
  uVar9 = VVar10.m_data._8_8_;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  levelStorage.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(*pVVar7) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    VVar1 = pVVar7[2];
    uVar9 = *(undefined8 *)(pVVar8 + 8);
    uVar4 = *(undefined8 *)(pVVar8 + 10);
    iVar3 = *(int *)(uVar9 + 0xc);
    for (VVar6 = pVVar7[1]; VVar6 < (VkImageViewType)((long)(uVar4 - uVar9) / 0x28);
        VVar6 = VVar6 + VK_IMAGE_VIEW_TYPE_2D) {
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&wholeLevel,
                 (ConstPixelBufferAccess *)((long)(int)VVar6 * 0x28 + *(undefined8 *)(pVVar8 + 8)));
      tcu::getSubregion(&local_58,&wholeLevel,0,VVar1,wholeLevel.m_size.m_data[0],iVar3 - VVar1);
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      push_back(&levelStorage,&local_58);
    }
    tcu::Texture1DArrayView::Texture1DArrayView
              ((Texture1DArrayView *)&wholeLevel,
               (int)(((long)levelStorage.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)levelStorage.
                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28),
               levelStorage.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_68 = wholeLevel.m_format.order;
    VVar10 = tcu::Texture1DArrayView::sample
                       ((Texture1DArrayView *)this,(Sampler *)&local_68,samplePos.m_data[0],
                        samplePos.m_data[1],0.0);
    uVar9 = VVar10.m_data._8_8_;
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    VVar1 = pVVar7[2];
    uVar9 = *(undefined8 *)(pVVar8 + 8);
    uVar4 = *(undefined8 *)(pVVar8 + 10);
    iVar3 = *(int *)(uVar9 + 0x10);
    for (VVar6 = pVVar7[1]; VVar6 < (VkImageViewType)((long)(uVar4 - uVar9) / 0x28);
        VVar6 = VVar6 + VK_IMAGE_VIEW_TYPE_2D) {
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&wholeLevel,
                 (ConstPixelBufferAccess *)((long)(int)VVar6 * 0x28 + *(undefined8 *)(pVVar8 + 8)));
      tcu::getSubregion(&local_58,&wholeLevel,0,0,VVar1,wholeLevel.m_size.m_data[0],
                        wholeLevel.m_size.m_data[1],iVar3 - VVar1);
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      push_back(&levelStorage,&local_58);
    }
    tcu::Texture2DArrayView::Texture2DArrayView
              ((Texture2DArrayView *)&wholeLevel,
               (int)(((long)levelStorage.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)levelStorage.
                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28),
               levelStorage.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_68 = wholeLevel.m_format.order;
    VVar10 = tcu::Texture2DArrayView::sample
                       ((Texture2DArrayView *)this,(Sampler *)&local_68,samplePos.m_data[0],
                        samplePos.m_data[1],samplePos.m_data[2],0.0);
    uVar9 = VVar10.m_data._8_8_;
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    uVar9 = *(undefined8 *)(pVVar8 + 10);
    uVar4 = *(undefined8 *)(pVVar8 + 8);
    for (VVar6 = pVVar7[1]; VVar6 < (VkImageViewType)((long)(uVar9 - uVar4) / 0x28);
        VVar6 = VVar6 + VK_IMAGE_VIEW_TYPE_2D) {
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      push_back(&levelStorage,(value_type *)((long)(int)VVar6 * 0x28 + *(undefined8 *)(pVVar8 + 8)))
      ;
    }
    tcu::Texture3DView::Texture3DView
              ((Texture3DView *)&wholeLevel,
               (int)(((long)levelStorage.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)levelStorage.
                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28),
               levelStorage.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_58.m_format.order = wholeLevel.m_format.order;
    VVar10 = tcu::Texture3DView::sample
                       ((Texture3DView *)this,(Sampler *)&local_58,samplePos.m_data[0],
                        samplePos.m_data[1],samplePos.m_data[2],0.0);
    uVar9 = VVar10.m_data._8_8_;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    VVar1 = pVVar7[2];
    uVar9 = *(undefined8 *)(pVVar8 + 8);
    uVar4 = *(undefined8 *)(pVVar8 + 10);
    uVar2 = *(uint *)(uVar9 + 0x10);
    for (VVar6 = pVVar7[1]; VVar6 < (VkImageViewType)((long)(uVar4 - uVar9) / 0x28);
        VVar6 = VVar6 + VK_IMAGE_VIEW_TYPE_2D) {
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&wholeLevel,
                 (ConstPixelBufferAccess *)((long)(int)VVar6 * 0x28 + *(undefined8 *)(pVVar8 + 8)));
      tcu::getSubregion(&local_58,&wholeLevel,0,0,VVar1 * 6,wholeLevel.m_size.m_data[0],
                        wholeLevel.m_size.m_data[1],(uVar2 / 6 - VVar1) * 6);
      std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      push_back(&levelStorage,&local_58);
    }
    tcu::TextureCubeArrayView::TextureCubeArrayView
              ((TextureCubeArrayView *)&wholeLevel,
               (int)(((long)levelStorage.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)levelStorage.
                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28),
               levelStorage.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_68 = wholeLevel.m_format.order;
    VVar10 = tcu::TextureCubeArrayView::sample
                       ((TextureCubeArrayView *)this,(Sampler *)&local_68,samplePos.m_data[0],
                        samplePos.m_data[1],samplePos.m_data[2],samplePos.m_data[3],0.0);
    uVar9 = VVar10.m_data._8_8_;
    break;
  default:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  }
  std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
  ~_Vector_base(&levelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               );
  VVar10.m_data[1] = (float)extraout_XMM0_Db;
  VVar10.m_data[0] = (float)extraout_XMM0_Da;
  VVar10.m_data[2] = (float)(int)uVar9;
  VVar10.m_data[3] = (float)(int)((ulong)uVar9 >> 0x20);
  return (Vec4)VVar10.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::fetchSampleValue (int samplePosNdx) const
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	// texture order is ABAB
	const bool									isSamplerCase	= (m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER);
	const tcu::TextureLevelPyramid&				sampleSrcA		= m_sourceImageA;
	const tcu::TextureLevelPyramid&				sampleSrcB		= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? (m_sourceImageA) : (m_sourceImageB);
	const tcu::TextureLevelPyramid&				sampleSrc		= (isSamplerCase) ? (sampleSrcA) : ((samplePosNdx % 2) == 0) ? (sampleSrcA) : (sampleSrcB);

	// sampler order is ABAB
	const tcu::Sampler&							samplerA		= m_refSamplerA;
	const tcu::Sampler&							samplerB		= (m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? (m_refSamplerA) : (m_refSamplerB);
	const tcu::Sampler&							sampler			= ((samplePosNdx % 2) == 0) ? (samplerA) : (samplerB);

	const tcu::Vec4								samplePos		= getSamplePos(m_viewType, m_baseMipLevel, m_baseArraySlice, samplePosNdx);
	const float									lod				= 0.0f;
	std::vector<tcu::ConstPixelBufferAccess>	levelStorage;

	switch (m_viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:	return getRef1DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:	return getRef2DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_3D:			return getRef3DView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), lod);
		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:	return getRefCubeView(sampleSrc, m_baseMipLevel, m_baseArraySlice, &levelStorage).sample(sampler, samplePos.x(), samplePos.y(), samplePos.z(), samplePos.w(), lod);

		default:
		{
			DE_FATAL("Impossible");
			return tcu::Vec4();
		}
	}
}